

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O3

void XCryptionCommon::append(ByteList *ioTargetList,ByteList *inSource)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  for (p_Var2 = (inSource->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)inSource;
      p_Var2 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var2->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next) {
    p_Var3 = (_List_node_base *)operator_new(0x18);
    *(undefined1 *)&p_Var3[1]._M_next = *(undefined1 *)&p_Var2[1]._M_next;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(ioTargetList->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void XCryptionCommon::append(ByteList& ioTargetList, const ByteList& inSource) {
	ByteList::const_iterator it = inSource.begin();

	for (; it != inSource.end(); ++it)
		ioTargetList.push_back(*it);
}